

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

bool absl::lts_20250127::ParseTime
               (string_view format,string_view input,TimeZone tz,Time *time,string *err)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  size_type __rlen;
  char *__s1;
  ulong __n;
  string error;
  HiRep local_c0;
  femtoseconds local_b8;
  string local_b0;
  time_zone local_90;
  size_t local_88;
  char *local_80;
  string local_78;
  string local_58;
  time_zone local_38;
  
  local_80 = format._M_str;
  local_88 = format._M_len;
  __s1 = input._M_str;
  uVar4 = input._M_len;
  local_90 = tz.cz_.impl_;
  if (uVar4 != 0) {
    pcVar1 = __s1 + uVar4;
    do {
      iVar3 = isspace((int)*__s1);
      if (iVar3 == 0) goto LAB_0104932d;
      __s1 = __s1 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = 0;
    __s1 = pcVar1;
  }
LAB_0104932d:
  lVar5 = 0;
  do {
    __n = *(ulong *)((long)&ParseTime::literals[0].size + lVar5);
    if ((__n == 0) ||
       ((__n <= uVar4 &&
        (iVar3 = bcmp(__s1,*(void **)((long)&ParseTime::literals[0].name + lVar5),__n), iVar3 == 0))
       )) {
      while( true ) {
        if (uVar4 == __n) {
          (time->rep_).rep_lo_ =
               *(uint32_t *)((long)&ParseTime::literals[0].value.rep_.rep_lo_ + lVar5);
          (time->rep_).rep_hi_ =
               *(HiRep *)((long)&ParseTime::literals[0].value.rep_.rep_hi_.lo_ + lVar5);
          return true;
        }
        iVar3 = isspace((int)__s1[__n]);
        if (iVar3 == 0) break;
        __n = __n + 1;
      }
    }
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x40);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_c0.lo_ = 0;
  local_c0.hi_ = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,local_80,local_80 + local_88);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,__s1,__s1 + uVar4);
  local_38.impl_ = local_90.impl_;
  bVar2 = time_internal::cctz::detail::parse
                    (&local_b0,&local_78,&local_38,(time_point<seconds> *)&local_c0,&local_b8,
                     &local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    (time->rep_).rep_hi_ = local_c0;
    (time->rep_).rep_lo_ =
         SUB164(SEXT816(0x431bde82d7b634db) * SEXT816(local_b8.__r),10) -
         (SUB164(SEXT816(0x431bde82d7b634db) * SEXT816(local_b8.__r),0xc) >> 0x1f);
  }
  else if (err != (string *)0x0) {
    std::__cxx11::string::operator=((string *)err,(string *)&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool ParseTime(absl::string_view format, absl::string_view input,
               absl::TimeZone tz, absl::Time* time, std::string* err) {
  auto strip_leading_space = [](absl::string_view* sv) {
    while (!sv->empty()) {
      if (!std::isspace(sv->front())) return;
      sv->remove_prefix(1);
    }
  };

  // Portable toolchains means we don't get nice constexpr here.
  struct Literal {
    const char* name;
    size_t size;
    absl::Time value;
  };
  static Literal literals[] = {
      {kInfiniteFutureStr, strlen(kInfiniteFutureStr), InfiniteFuture()},
      {kInfinitePastStr, strlen(kInfinitePastStr), InfinitePast()},
  };
  strip_leading_space(&input);
  for (const auto& lit : literals) {
    if (absl::StartsWith(input, absl::string_view(lit.name, lit.size))) {
      absl::string_view tail = input;
      tail.remove_prefix(lit.size);
      strip_leading_space(&tail);
      if (tail.empty()) {
        *time = lit.value;
        return true;
      }
    }
  }

  std::string error;
  cctz_parts parts;
  const bool b =
      cctz::detail::parse(std::string(format), std::string(input),
                          cctz::time_zone(tz), &parts.sec, &parts.fem, &error);
  if (b) {
    *time = Join(parts);
  } else if (err != nullptr) {
    *err = std::move(error);
  }
  return b;
}